

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall QPDF::insertPage(QPDF *this,QPDFObjectHandle *newpage,int pos)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  int pos_00;
  QPDF *pQVar5;
  pointer pcVar6;
  size_type sVar7;
  unsigned_long __n;
  reference obj;
  runtime_error *this_00;
  _Alloc_hider _Var8;
  string *psVar9;
  int pos_local;
  _Alloc_hider in_stack_ffffffffffffff48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0 [3];
  allocator<char> local_91;
  QPDFObjectHandle pages;
  QPDFObjectHandle kids;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  QPDFObjGen og;
  
  pos_local = pos;
  flattenPagesTree(this);
  bVar3 = QPDFObjectHandle::isIndirect(newpage);
  if (bVar3) {
    pQVar5 = QPDFObjectHandle::getOwningQPDF(newpage);
    if (pQVar5 == this) goto LAB_001f05ac;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff48,"",(allocator<char> *)&pages);
    pQVar5 = QPDFObjectHandle::getQPDF(newpage,(string *)&stack0xffffffffffffff48);
    pushInheritedAttributesToPage(pQVar5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage);
    copyForeignObject((QPDF *)&stack0xffffffffffffff48,(QPDFObjectHandle *)this);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
    p_Var2 = &local_50;
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage);
    makeIndirectObject((QPDF *)&stack0xffffffffffffff48,(QPDFObjectHandle *)this);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
    p_Var2 = &local_40;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
LAB_001f05ac:
  if (-1 < pos_local) {
    pcVar6 = (pointer)QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&pos_local);
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    _Var8._M_p = (pointer)((long)*(pointer *)((long)&(_Var1._M_head_impl)->all_pages + 8) -
                           *(long *)&((_Var1._M_head_impl)->all_pages).
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                          >> 4);
    if (pcVar6 <= _Var8._M_p) {
      if (pos_local != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                  ((unsigned_long *)&stack0xffffffffffffff48);
        in_stack_ffffffffffffff48._M_p = _Var8._M_p;
      }
      og = QPDFObjectHandle::getObjGen(newpage);
      sVar7 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                       pageobj_to_pages_pos,&og);
      if (sVar7 != 0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pages,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage);
        QPDFObjectHandle::shallowCopy(&local_60);
        makeIndirectObject((QPDF *)&stack0xffffffffffffff48,(QPDFObjectHandle *)this);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)newpage,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff48)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pages.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      getRoot((QPDF *)&kids);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff48,"/Pages",(allocator<char> *)&local_70);
      QPDFObjectHandle::getKey(&pages,(string *)&kids);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff48,"/Kids",(allocator<char> *)&local_70);
      QPDFObjectHandle::getKey(&kids,(string *)&pages);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff48,"/Parent",(allocator<char> *)&local_70);
      QPDFObjectHandle::replaceKey(newpage,(string *)&stack0xffffffffffffff48,&pages);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      QPDFObjectHandle::insertItem(&kids,pos_local,newpage);
      iVar4 = QPDFObjectHandle::getArrayNItems(&kids);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff48,"/Count",&local_91);
      QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff48._M_p);
      QPDFObjectHandle::replaceKey(&pages,(string *)&stack0xffffffffffffff48,&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::insert
                (&(_Var1._M_head_impl)->all_pages,
                 (QPDFObjectHandle *)
                 ((long)pos_local * 0x10 +
                 *(long *)&((_Var1._M_head_impl)->all_pages).
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>),
                 newpage);
      psVar9 = (string *)&pos_local;
      while (pos_00 = *(int *)psVar9 + 1, pos_00 < iVar4) {
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                        ((int *)&stack0xffffffffffffff48);
        obj = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                        (&(_Var1._M_head_impl)->all_pages,__n);
        insertPageobjToPage(this,obj,pos_00,false);
        psVar9 = (string *)&stack0xffffffffffffff48;
      }
      insertPageobjToPage(this,newpage,pos_local,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pages.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"QPDF::insertPage called with pos out of range");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::insertPage(QPDFObjectHandle newpage, int pos)
{
    // pos is numbered from 0, so pos = 0 inserts at the beginning and pos = npages adds to the end.

    flattenPagesTree();

    if (!newpage.isIndirect()) {
        QTC::TC("qpdf", "QPDF insert non-indirect page");
        newpage = makeIndirectObject(newpage);
    } else if (newpage.getOwningQPDF() != this) {
        QTC::TC("qpdf", "QPDF insert foreign page");
        newpage.getQPDF().pushInheritedAttributesToPage();
        newpage = copyForeignObject(newpage);
    } else {
        QTC::TC("qpdf", "QPDF insert indirect page");
    }

    if ((pos < 0) || (toS(pos) > m->all_pages.size())) {
        throw std::runtime_error("QPDF::insertPage called with pos out of range");
    }

    QTC::TC(
        "qpdf",
        "QPDF insert page",
        (pos == 0) ? 0 :                            // insert at beginning
            (pos == toI(m->all_pages.size())) ? 1   // at end
                                              : 2); // insert in middle

    auto og = newpage.getObjGen();
    if (m->pageobj_to_pages_pos.count(og)) {
        QTC::TC("qpdf", "QPDF resolve duplicated page in insert");
        newpage = makeIndirectObject(QPDFObjectHandle(newpage).shallowCopy());
    }

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    newpage.replaceKey("/Parent", pages);
    kids.insertItem(pos, newpage);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.insert(m->all_pages.begin() + pos, newpage);
    for (int i = pos + 1; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
    insertPageobjToPage(newpage, pos, true);
}